

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

carrier_uint
fmt::v8::detail::dragonbox::cache_accessor<float>::compute_round_up_for_shorter_interval_case
          (cache_entry_type *cache,int beta_minus_1)

{
  int beta_minus_1_local;
  cache_entry_type *cache_local;
  
  return (int)(*cache >> (0x27U - (char)beta_minus_1 & 0x3f)) + 1U >> 1;
}

Assistant:

static carrier_uint compute_round_up_for_shorter_interval_case(
      const cache_entry_type& cache, int beta_minus_1) FMT_NOEXCEPT {
    return (static_cast<carrier_uint>(
                cache >>
                (64 - float_info<float>::significand_bits - 2 - beta_minus_1)) +
            1) /
           2;
  }